

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O2

void google::protobuf::internal::ZeroFieldsBase::CopyImpl(Message *to_param,Message *from_param)

{
  ZeroFieldsBase *from;
  ZeroFieldsBase *to;
  InternalMetadata *this;
  
  if (from_param != to_param) {
    this = &(to_param->super_MessageLite)._internal_metadata_;
    InternalMetadata::Clear<google::protobuf::UnknownFieldSet>(this);
    InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (this,&(from_param->super_MessageLite)._internal_metadata_);
    return;
  }
  return;
}

Assistant:

void ZeroFieldsBase::CopyImpl(Message& to_param, const Message& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  if (from == to) return;
  to->_internal_metadata_.Clear<UnknownFieldSet>();
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}